

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

void Cba_BlastShiftRight(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,int fSticky,
                        Vec_Int_t *vRes)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int local_5c;
  
  vRes->nSize = 0;
  if (0 < nNum) {
    uVar7 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar7]);
      uVar7 = uVar7 + 1;
    } while ((uint)nNum != uVar7);
  }
  if (fSticky == 0) {
    local_5c = 0;
  }
  else {
    local_5c = pNum[(long)nNum + -1];
  }
  if (0 < nShift) {
    piVar1 = vRes->pArray;
    uVar7 = 0x20;
    if (nShift < 0x20) {
      uVar7 = (ulong)(uint)nShift;
    }
    uVar5 = 0;
    bVar2 = false;
    do {
      if (0 < nNum - fSticky) {
        iVar6 = 1 << ((byte)uVar5 & 0x1f);
        lVar8 = (long)iVar6;
        uVar4 = 0;
        do {
          if ((bVar2) || (nNum <= lVar8)) {
            iVar3 = Gia_ManHashMux(pNew,pShift[uVar5],local_5c,piVar1[uVar4]);
            piVar1[uVar4] = iVar3;
            if (nNum < iVar6) {
              bVar2 = true;
            }
          }
          else {
            iVar3 = Gia_ManHashMux(pNew,pShift[uVar5],piVar1[lVar8],piVar1[uVar4]);
            piVar1[uVar4] = iVar3;
            bVar2 = false;
          }
          uVar4 = uVar4 + 1;
          lVar8 = lVar8 + 1;
        } while ((uint)(nNum - fSticky) != uVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar7);
  }
  return;
}

Assistant:

void Cba_BlastShiftRight( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, int fSticky, Vec_Int_t * vRes )
{
    int * pRes = Cba_VecCopy( vRes, pNum, nNum );
    int Fill = fSticky ? pNum[nNum-1] : 0;
    int i, j, fShort = 0;
    if ( nShift > 32 )
        nShift = 32;
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++ ) 
        for( j = 0; j < nNum - fSticky; j++ ) 
        {
            if( fShort || j + (1<<i) >= nNum ) 
            {
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], Fill, pRes[j] );
                if ( (1<<i) > nNum ) 
                    fShort = 1;
            } 
            else 
                pRes[j] = Gia_ManHashMux( pNew, pShift[i], pRes[j+(1<<i)], pRes[j] );
        }
}